

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::MarbleTexture::Evaluate(MarbleTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  Float FVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar15 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  undefined1 in_ZMM3 [64];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  Point3f PVar26;
  SampledSpectrum SVar27;
  undefined1 local_e8 [16];
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 local_80;
  RGB local_78;
  Tuple3<pbrt::Point3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  Tuple3<pbrt::Vector3,_float> local_48;
  RGBReflectanceSpectrum local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.z = 0.0;
  auVar15 = ZEXT856((ulong)ctx._8_8_);
  auVar19 = in_ZMM3._4_12_;
  PVar26 = TransformMapping3D::Map
                     ((TransformMapping3D *)
                      ((this->mapping).super_TaggedPointer<pbrt::TransformMapping3D>.bits &
                      0xffffffffffff),ctx,(Vector3f *)&local_48,(Vector3f *)&local_58);
  auVar12._0_8_ = PVar26.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar12._8_56_ = auVar15;
  vmovlps_avx(auVar12._0_16_);
  local_38.rgb.g = this->scale;
  auVar8._0_4_ = local_38.rgb.g * PVar26.super_Tuple3<pbrt::Point3,_float>.x;
  auVar8._4_4_ = local_38.rgb.g * PVar26.super_Tuple3<pbrt::Point3,_float>.y;
  auVar8._8_4_ = local_38.rgb.g * auVar15._0_4_;
  auVar8._12_4_ = local_38.rgb.g * auVar15._4_4_;
  local_68._0_8_ = vmovlps_avx(auVar8);
  local_68.z = PVar26.super_Tuple3<pbrt::Point3,_float>.z * local_38.rgb.g;
  FVar1 = this->variation;
  auVar9._0_4_ = local_38.rgb.g * local_48.x;
  auVar9._4_4_ = local_38.rgb.g * local_48.y;
  auVar9._8_4_ = local_38.rgb.g * 0.0;
  auVar9._12_4_ = local_38.rgb.g * 0.0;
  local_e8._0_8_ = vmovlps_avx(auVar9);
  local_e8._8_4_ = local_38.rgb.g * local_48.z;
  auVar10._0_4_ = local_38.rgb.g * local_58.x;
  auVar10._4_4_ = local_38.rgb.g * local_58.y;
  auVar10._8_4_ = local_38.rgb.g * 0.0;
  auVar10._12_4_ = local_38.rgb.g * 0.0;
  local_38.rgb.g = local_38.rgb.g * local_58.z;
  local_38._0_8_ = vmovlps_avx(auVar10);
  auVar13._0_4_ =
       FBm((Point3f *)&local_68,(Vector3f *)local_e8,(Vector3f *)&local_38,this->omega,this->octaves
          );
  auVar13._4_60_ = extraout_var;
  auVar8 = vmovshdup_avx(auVar8);
  auVar8 = vfmadd132ss_fma(auVar13._0_16_,auVar8,ZEXT416((uint)FVar1));
  auVar14._0_4_ = sinf(auVar8._0_4_);
  auVar14._4_60_ = extraout_var_00;
  auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),auVar14._0_16_,
                           SUB6416(ZEXT464(0x3f000000),0));
  local_e8._0_4_ = 0.58;
  local_e8._4_4_ = 0.58;
  local_e8._8_8_ = 0x3f147ae13f19999a;
  uStack_d8 = 0x3f19999a3f147ae1;
  uStack_d0 = 0x3f147ae13f147ae1;
  uStack_c8 = 0x3f0000003f19999a;
  uStack_c0 = 0x3f0000003f000000;
  uStack_b8 = 0x3f170a3d3f19999a;
  uStack_b0 = 0x3f147ae13f147ae1;
  local_a8 = 0x3f19999a3f147ae1;
  uStack_a0 = 0x3f147ae13f147ae1;
  uStack_98 = 0x3e4ccccd3f19999a;
  uStack_90 = 0x3ea8f5c33e4ccccd;
  auVar11._8_4_ = 0x3f147ae1;
  auVar11._0_8_ = 0x3f147ae13f147ae1;
  auVar11._12_4_ = 0x3f147ae1;
  local_88 = vmovlps_avx(auVar11);
  local_80 = 0x3f19999a;
  auVar8 = ZEXT416((uint)(auVar9._0_4_ * 6.0));
  auVar8 = vroundss_avx(auVar8,auVar8,9);
  iVar7 = 5;
  if ((int)auVar8._0_4_ < 5) {
    iVar7 = (int)auVar8._0_4_;
  }
  auVar18._0_4_ = (float)iVar7;
  auVar18._4_12_ = auVar19;
  auVar8 = vfmsub231ss_fma(auVar18,SUB6416(ZEXT464(0x40c00000),0),auVar9);
  fVar17 = auVar8._0_4_;
  fVar5 = 1.0 - fVar17;
  fVar3 = (float)*(undefined8 *)(local_e8 + (long)(iVar7 + 1) * 0xc);
  fVar4 = (float)((ulong)*(undefined8 *)(local_e8 + (long)(iVar7 + 1) * 0xc) >> 0x20);
  fVar2 = *(float *)(local_e8 + (long)(iVar7 + 2) * 0xc + 8) * fVar17 +
          fVar5 * *(float *)(local_e8 + (long)(iVar7 + 1) * 0xc + 8);
  fVar24 = (float)*(undefined8 *)(local_e8 + (long)(iVar7 + 2) * 0xc);
  fVar25 = (float)((ulong)*(undefined8 *)(local_e8 + (long)(iVar7 + 2) * 0xc) >> 0x20);
  fVar20 = fVar24 * fVar17 + fVar5 * fVar3;
  fVar21 = fVar25 * fVar17 + fVar5 * fVar4;
  fVar22 = fVar17 * 0.0 + fVar5 * 0.0;
  fVar23 = fVar17 * 0.0 + fVar5 * 0.0;
  auVar16._0_4_ =
       fVar17 * (fVar5 * fVar20 +
                fVar17 * (fVar24 * fVar5 +
                         fVar17 * (float)*(undefined8 *)(local_e8 + (long)(iVar7 + 3) * 0xc))) +
       fVar5 * (fVar17 * fVar20 +
               fVar5 * (fVar17 * fVar3 +
                       fVar5 * (float)*(undefined8 *)(local_e8 + (long)iVar7 * 0xc)));
  auVar16._4_4_ =
       fVar17 * (fVar5 * fVar21 +
                fVar17 * (fVar25 * fVar5 +
                         fVar17 * (float)((ulong)*(undefined8 *)(local_e8 + (long)(iVar7 + 3) * 0xc)
                                         >> 0x20))) +
       fVar5 * (fVar17 * fVar21 +
               fVar5 * (fVar17 * fVar4 +
                       fVar5 * (float)((ulong)*(undefined8 *)(local_e8 + (long)iVar7 * 0xc) >> 0x20)
                       ));
  auVar16._8_4_ =
       fVar17 * (fVar5 * fVar22 + fVar17 * (fVar5 * 0.0 + fVar17 * 0.0)) +
       fVar5 * (fVar17 * fVar22 + fVar5 * (fVar17 * 0.0 + fVar5 * 0.0));
  auVar16._12_4_ =
       fVar17 * (fVar5 * fVar23 + fVar17 * (fVar5 * 0.0 + fVar17 * 0.0)) +
       fVar5 * (fVar17 * fVar23 + fVar5 * (fVar17 * 0.0 + fVar5 * 0.0));
  auVar6._8_4_ = 0x3fc00000;
  auVar6._0_8_ = 0x3fc000003fc00000;
  auVar6._12_4_ = 0x3fc00000;
  auVar8 = vmulps_avx512vl(auVar16,auVar6);
  local_78.b = (fVar5 * (fVar17 * fVar2 +
                        fVar5 * (fVar5 * *(float *)(local_e8 + (long)iVar7 * 0xc + 8) +
                                fVar17 * *(float *)(local_e8 + (long)(iVar7 + 1) * 0xc + 8))) +
               fVar17 * ((*(float *)(local_e8 + (long)(iVar7 + 2) * 0xc + 8) * fVar5 +
                         fVar17 * *(float *)(local_e8 + (long)(iVar7 + 3) * 0xc + 8)) * fVar17 +
                        fVar5 * fVar2)) * 1.5;
  local_78._0_8_ = vmovlps_avx(auVar8);
  RGBReflectanceSpectrum::RGBReflectanceSpectrum(&local_38,RGBColorSpace::sRGB,&local_78);
  SVar27 = RGBReflectanceSpectrum::Sample(&local_38,&lambda);
  return (array<float,_4>)(array<float,_4>)SVar27;
}

Assistant:

SampledSpectrum MarbleTexture::Evaluate(TextureEvalContext ctx,
                                        SampledWavelengths lambda) const {
    Vector3f dpdx, dpdy;
    Point3f p = mapping.Map(ctx, &dpdx, &dpdy);
    p *= scale;
    Float marble = p.y + variation * FBm(p, scale * dpdx, scale * dpdy, omega, octaves);
    Float t = .5f + .5f * std::sin(marble);
    // Evaluate marble spline at _t_
    const RGB c[] = {
        {.58f, .58f, .6f}, {.58f, .58f, .6f}, {.58f, .58f, .6f},
        {.5f, .5f, .5f},   {.6f, .59f, .58f}, {.58f, .58f, .6f},
        {.58f, .58f, .6f}, {.2f, .2f, .33f},  {.58f, .58f, .6f},
    };
    int nSeg = PBRT_ARRAYSIZE(c) - 3;
    int first = std::min<int>(std::floor(t * nSeg), nSeg - 1);
    t = (t * nSeg - first);
    // Bezier spline evaluated with de Castilejau's algorithm
    RGB s0 = Lerp(t, c[first], c[first + 1]);
    RGB s1 = Lerp(t, c[first + 1], c[first + 2]);
    RGB s2 = Lerp(t, c[first + 2], c[first + 3]);
    s0 = Lerp(t, s0, s1);
    s1 = Lerp(t, s1, s2);
    // Extra scale of 1.5 to increase variation among colors
    s0 = 1.5f * Lerp(t, s0, s1);
#ifdef PBRT_IS_GPU_CODE
    return RGBReflectanceSpectrum(*RGBColorSpace_sRGB, s0).Sample(lambda);
#else
    return RGBReflectanceSpectrum(*RGBColorSpace::sRGB, s0).Sample(lambda);
#endif
}